

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::evaluateHierarchicalFunctionsGPU
          (GridLocalPolynomial *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  CudaLocalPolynomialData<double> *pCVar1;
  MultiIndexSet *pMVar2;
  TypeOneDRule TVar3;
  
  loadGpuBasis<double>(this);
  TVar3 = rule_localpb;
  if ((ulong)this->effective_rule < 4) {
    TVar3 = *(TypeOneDRule *)(&DAT_001d09a0 + (ulong)this->effective_rule * 4);
  }
  pMVar2 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar2 = &(this->super_BaseCanonicalGrid).needed;
  }
  pCVar1 = (this->gpu_cache)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaLocalPolynomialData<double>,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaLocalPolynomialData<double>_*,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
           .super__Head_base<0UL,_TasGrid::CudaLocalPolynomialData<double>_*,_false>._M_head_impl;
  TasGpu::devalpwpoly<double>
            ((this->super_BaseCanonicalGrid).acceleration,this->order,TVar3,
             (this->super_BaseCanonicalGrid).num_dimensions,cpu_num_x,pMVar2->cache_num_indexes,
             gpu_x,(pCVar1->nodes).gpu_data,(pCVar1->support).gpu_data,gpu_y);
  return;
}

Assistant:

void GridLocalPolynomial::evaluateHierarchicalFunctionsGPU(const double gpu_x[], int cpu_num_x, double *gpu_y) const{
    loadGpuBasis<double>();
    TasGpu::devalpwpoly(acceleration, order, RuleLocal::getRule(effective_rule), num_dimensions, cpu_num_x, getNumPoints(), gpu_x, gpu_cache->nodes.data(), gpu_cache->support.data(), gpu_y);
}